

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::SparsemaxLoss::backward_impl
          (SparsemaxLoss *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  size_type sVar1;
  Scalar *pSVar2;
  long in_RCX;
  ulong uVar3;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  Tensor *in_RDI;
  undefined1 auVar4 [16];
  undefined1 in_ZMM1 [64];
  uint i_1;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> sm;
  Tensor tsm;
  float dqprop;
  float *psm;
  float d;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  float fVar5;
  Dim *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea8;
  float fVar6;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *this_00
  ;
  Tensor *in_stack_fffffffffffffeb8;
  float *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  uint uVar7;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  local_90 [76];
  float local_44;
  undefined8 local_40;
  float local_34;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_10;
  
  auVar4 = in_ZMM1._0_16_;
  fVar6 = **(float **)(in_RCX + 0x28);
  local_40 = *(undefined8 *)in_RDI[1].d.d;
  local_34 = fVar6;
  local_10 = in_RSI;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)&in_RDI[1].d.bd);
  auVar4 = vcvtusi2ss_avx512f(auVar4,sVar1);
  local_44 = fVar6 / auVar4._0_4_;
  std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_10,0);
  this_00 = local_90;
  Tensor::Tensor(in_RDI,in_stack_fffffffffffffe98,
                 (float *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  Tensor::operator*(in_stack_fffffffffffffeb8);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::operator*
            ((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
              *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             in_stack_fffffffffffffed0);
  Tensor::operator*(in_stack_fffffffffffffeb8);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::operator+=
            (this_00,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>_>
                      *)CONCAT44(fVar6,in_stack_fffffffffffffea8));
  uVar7 = 0;
  while( true ) {
    uVar3 = (ulong)uVar7;
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)&in_RDI[1].d.bd);
    if (sVar1 <= uVar3) break;
    fVar5 = local_44;
    Tensor::operator*(in_stack_fffffffffffffeb8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)&in_RDI[1].d.bd,(ulong)uVar7
              );
    pSVar2 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()((DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                           *)this_00,CONCAT44(fVar6,in_stack_fffffffffffffea8),(Index)in_RDI);
    *pSVar2 = *pSVar2 - fVar5;
    uVar7 = uVar7 + 1;
  }
  Tensor::~Tensor((Tensor *)0x623ae2);
  return;
}

Assistant:

void SparsemaxLoss::backward_impl(const vector<const Tensor*>& xs,
                                  const Tensor& fx,
                                  const Tensor& dEdf,
                                  unsigned i,
                                  Tensor& dEdxi) const {
#if HAVE_CUDA
  throw std::runtime_error("SparsemaxLoss not implemented on GPU");
#else
  const float d = dEdf.v[0];
  float* psm = static_cast<float*>(aux_mem);
  float dqprop = d / pq->size();
  Tensor tsm(xs[0]->d, psm);
  auto sm = *tsm;  // sparsemax(z)
  *dEdxi += sm * d;
  for (unsigned i = 0; i < pq->size(); ++i)
    (*dEdxi)((*pq)[i], 0) -= dqprop;
#endif
}